

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateRecorder::Impl::copy_physical_device_features
          (Impl *this,void *device_pnext,ScratchAllocator *alloc,VkPhysicalDeviceFeatures2 **out_pdf
          )

{
  bool bVar1;
  VkPhysicalDeviceFeatures2 *pVVar2;
  
  pVVar2 = find_pnext<VkPhysicalDeviceFeatures2>((VkStructureType)device_pnext,device_pnext);
  if (pVVar2 != (VkPhysicalDeviceFeatures2 *)0x0) {
    pVVar2 = copy<VkPhysicalDeviceFeatures2>(this,pVVar2,1,alloc);
    pVVar2->pNext = (void *)0x0;
    bVar1 = copy_pnext_chain_pdf2(this,device_pnext,alloc,&pVVar2->pNext);
    if (bVar1) {
      *out_pdf = pVVar2;
      return true;
    }
  }
  return false;
}

Assistant:

bool StateRecorder::Impl::copy_physical_device_features(const void *device_pnext,
                                                        ScratchAllocator &alloc,
                                                        VkPhysicalDeviceFeatures2 **out_pdf)
{
	// Reorder so that PDF2 comes first in the chain.
	// Caller guarantees that PDF2 is part of the device_pnext.
	// If original application did not have PDF2, just synthesize one based on pEnabledFeatures instead.
	const auto *pdf = find_pnext<VkPhysicalDeviceFeatures2>(VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2,
	                                                        device_pnext);

	if (!pdf)
		return false;

	auto *features = copy(pdf, 1, alloc);
	features->pNext = nullptr;

	if (!copy_pnext_chain_pdf2(device_pnext, alloc, &features->pNext))
		return false;

	*out_pdf = features;
	return true;
}